

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void checkPropertyConsistency<char_const*>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,char **param_7)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  cmLocalGenerator *this;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined1 auVar5 [16];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string_view str;
  _Rb_tree_node_base *local_320;
  string local_2e8;
  undefined1 local_2c8 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string pfile;
  undefined1 local_100 [8];
  string pname;
  string *p;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  string pdir;
  _Rb_tree_node_base local_88;
  _Rb_tree_node_base *local_68;
  _Base_ptr local_60;
  undefined1 local_58 [8];
  cmList props;
  cmValue prop;
  CompatibleType t_local;
  string *config_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emitted_local;
  string *propName_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  
  props.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmGeneratorTarget::GetProperty(dependee,propName);
  bVar1 = cmValue::operator_cast_to_bool
                    ((cmValue *)
                     &props.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_
                       ((cmValue *)
                        &props.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar2);
    local_68 = &local_88;
    local_60 = (_Base_ptr)0x1;
    init._M_len = 1;
    init._M_array = (iterator)local_68;
    cmList::cmList((cmList *)local_58,init);
    _Var4._M_node = &local_88;
    local_320 = (_Rb_tree_node_base *)&local_68;
    do {
      local_320 = local_320 + -1;
      std::__cxx11::string::~string((string *)local_320);
    } while (local_320 != _Var4._M_node);
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmStrCat<std::__cxx11::string_const&,char_const(&)[16]>
              ((string *)&__range1,psVar2,(char (*) [16])"/Help/prop_tgt/");
    __end1 = cmList::begin_abi_cxx11_((cmList *)local_58);
    p = (string *)cmList::end_abi_cxx11_((cmList *)local_58);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&p), bVar1) {
      pname.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)pname.field_2._8_8_);
      str._M_len = auVar5._8_8_;
      pfile.field_2._8_8_ = auVar5._0_8_;
      str._M_str = (char *)_Var4._M_node;
      cmSystemTools::HelpFileName_abi_cxx11_
                ((string *)local_100,(cmSystemTools *)pfile.field_2._8_8_,str);
      std::operator+(&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     &local_150,".rst");
      std::__cxx11::string::~string((string *)&local_150);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_130,true);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
        poVar3 = std::operator<<((ostream *)local_2c8,"Target \"");
        psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        poVar3 = std::operator<<(poVar3,"\" has property \"");
        poVar3 = std::operator<<(poVar3,(string *)pname.field_2._8_8_);
        poVar3 = std::operator<<(poVar3,"\" listed in its ");
        poVar3 = std::operator<<(poVar3,(string *)propName);
        poVar3 = std::operator<<(poVar3,
                                 " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                                );
        poVar3 = std::operator<<(poVar3,(string *)propName);
        std::operator<<(poVar3," property.");
        this = cmGeneratorTarget::GetLocalGenerator(depender);
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      }
      else {
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(emitted,(value_type *)pname.field_2._8_8_);
        _Var4 = pVar6.first._M_node;
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          _Var4._M_node = (_Base_ptr)(ulong)t;
          getLinkInterfaceDependentProperty<char_const*>
                    (depender,(string *)pname.field_2._8_8_,config,t,(char **)0x0);
          bVar1 = cmSystemTools::GetErrorOccurredFlag();
          if (bVar1) {
            bVar1 = true;
            goto LAB_00a147d8;
          }
        }
        bVar1 = false;
      }
LAB_00a147d8:
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_100);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)&__range1);
    cmList::~cmList((cmList *)local_58);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  cmValue prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  cmList props{ *prop };
  std::string pdir =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Help/prop_tgt/");

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccurredFlag()) {
        return;
      }
    }
  }
}